

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * GetSafeProperty_abi_cxx11_
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,char *key)

{
  char *pcVar1;
  char *local_98;
  allocator local_5d [20];
  allocator local_49;
  string local_48;
  char *local_28;
  char *tmp;
  char *key_local;
  cmGeneratorTarget *target_local;
  
  tmp = key;
  key_local = (char *)target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,key,&local_49);
  pcVar1 = cmGeneratorTarget::GetProperty(target,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_98 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    local_98 = "";
  }
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,local_5d);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetSafeProperty(cmGeneratorTarget const* target,
                                   const char* key)
{
  const char* tmp = target->GetProperty(key);
  return std::string((tmp != CM_NULLPTR) ? tmp : "");
}